

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrittenFontCFF.cpp
# Opt level: O0

bool __thiscall
WrittenFontCFF::HasEnoughSpaceForGlyphs
          (WrittenFontCFF *this,GlyphUnicodeMappingListList *inGlyphsList)

{
  WrittenFontRepresentation *this_00;
  bool bVar1;
  pointer plVar2;
  pointer pGVar3;
  _Self local_60;
  uint local_54;
  _Self local_50;
  _Self local_48;
  _List_node_base *local_40;
  _Self local_38;
  int local_2c;
  const_iterator cStack_28;
  int glyphsToAddCount;
  const_iterator it;
  const_iterator itList;
  GlyphUnicodeMappingListList *inGlyphsList_local;
  WrittenFontCFF *this_local;
  
  it._M_node = (_List_node_base *)
               std::__cxx11::
               list<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
               ::begin(inGlyphsList);
  std::_List_const_iterator<GlyphUnicodeMapping>::_List_const_iterator(&stack0xffffffffffffffd8);
  local_2c = 0;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
         ::end(inGlyphsList);
    bVar1 = std::operator!=((_Self *)&it,&local_38);
    if (!bVar1) break;
    plVar2 = std::
             _List_const_iterator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>
             ::operator->((_List_const_iterator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>
                           *)&it);
    local_40 = (_List_node_base *)
               std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>::begin
                         (plVar2);
    cStack_28 = (const_iterator)local_40;
    while( true ) {
      plVar2 = std::
               _List_const_iterator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>
               ::operator->((_List_const_iterator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>
                             *)&it);
      local_48._M_node =
           (_List_node_base *)
           std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>::end
                     (plVar2);
      bVar1 = std::operator!=(&stack0xffffffffffffffd8,&local_48);
      if (!bVar1) break;
      this_00 = (this->super_AbstractWrittenFont).mANSIRepresentation;
      pGVar3 = std::_List_const_iterator<GlyphUnicodeMapping>::operator->(&stack0xffffffffffffffd8);
      local_54 = (uint)pGVar3->mGlyphCode;
      local_50._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_GlyphEncodingInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
           ::find(&this_00->mGlyphIDToEncodedChar,&local_54);
      local_60._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_GlyphEncodingInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
           ::end(&((this->super_AbstractWrittenFont).mANSIRepresentation)->mGlyphIDToEncodedChar);
      bVar1 = std::operator==(&local_50,&local_60);
      if (bVar1) {
        local_2c = local_2c + 1;
      }
      std::_List_const_iterator<GlyphUnicodeMapping>::operator++(&stack0xffffffffffffffd8);
    }
    std::
    _List_const_iterator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>
    ::operator++((_List_const_iterator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>
                  *)&it);
  }
  return local_2c <= (int)(uint)this->mAvailablePositionsCount;
}

Assistant:

bool WrittenFontCFF::HasEnoughSpaceForGlyphs(const GlyphUnicodeMappingListList& inGlyphsList)
{
	GlyphUnicodeMappingListList::const_iterator itList = inGlyphsList.begin();
	GlyphUnicodeMappingList::const_iterator it;
	int glyphsToAddCount = 0;

	for(; itList != inGlyphsList.end(); ++itList)
	{
		it = itList->begin();
		for(; it != itList->end(); ++it)
			if(mANSIRepresentation->mGlyphIDToEncodedChar.find(it->mGlyphCode) == mANSIRepresentation->mGlyphIDToEncodedChar.end())
				++glyphsToAddCount;
	}

	return glyphsToAddCount <= mAvailablePositionsCount;
}